

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int resolveAttachExpr(NameContext *pName,Expr *pExpr)

{
  int iVar1;
  int local_24;
  int rc;
  Expr *pExpr_local;
  NameContext *pName_local;
  
  local_24 = 0;
  if (pExpr != (Expr *)0x0) {
    if (pExpr->op == '\x1a') {
      pExpr->op = '^';
    }
    else {
      local_24 = sqlite3ResolveExprNames(pName,pExpr);
      if ((local_24 == 0) && (iVar1 = sqlite3ExprIsConstant(pExpr), iVar1 == 0)) {
        sqlite3ErrorMsg(pName->pParse,"invalid name: \"%s\"",(pExpr->u).zToken);
        return 1;
      }
    }
  }
  return local_24;
}

Assistant:

static int resolveAttachExpr(NameContext *pName, Expr *pExpr)
{
  int rc = SQLITE_OK;
  if( pExpr ){
    if( pExpr->op!=TK_ID ){
      rc = sqlite3ResolveExprNames(pName, pExpr);
      if( rc==SQLITE_OK && !sqlite3ExprIsConstant(pExpr) ){
        sqlite3ErrorMsg(pName->pParse, "invalid name: \"%s\"", pExpr->u.zToken);
        return SQLITE_ERROR;
      }
    }else{
      pExpr->op = TK_STRING;
    }
  }
  return rc;
}